

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool gen_shift(DisasContext_conflict12 *ctx,arg_r_conflict *a,
               _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict11 *func)

{
  TCGContext_conflict11 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_get_gpr(tcg_ctx,t,a->rs1);
  gen_get_gpr(tcg_ctx,t_00,a->rs2);
  tcg_gen_andi_i64_riscv64(tcg_ctx,t_00,t_00,0x3f);
  (*func)(tcg_ctx,t,t,t_00);
  gen_set_gpr(tcg_ctx,a->rd,t);
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return (_Bool)extraout_AL;
}

Assistant:

static void gen_shift(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /*
         * If no destination, treat it as a NOP.
         * For add & sub, we must generate the overflow exception when needed.
         */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    switch (opc) {
    case OPC_SLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shl_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_SRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_SRLV:
        tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x1f);
        tcg_gen_shr_tl(tcg_ctx, t0, t1, t0);
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
        break;
    case OPC_ROTRV:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);

            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_andi_i32(tcg_ctx, t2, t2, 0x1f);
            tcg_gen_rotr_i32(tcg_ctx, t2, t3, t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DSLLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shl_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRAV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_sar_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DSRLV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_shr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
    case OPC_DROTRV:
        tcg_gen_andi_tl(tcg_ctx, t0, t0, 0x3f);
        tcg_gen_rotr_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}